

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall Game::hasCard(Game *this,size_t playerID,Card card)

{
  pointer pvVar1;
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> _Var2;
  undefined8 uVar3;
  ulong uVar4;
  value_type playerHand;
  vector<Card,_std::allocator<Card>_> local_48;
  vector<Card,_std::allocator<Card>_> local_30;
  Card local_18;
  
  pvVar1 = (this->m_playerCards).
           super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->m_playerCards).
                 super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (playerID <= uVar4 && uVar4 - playerID != 0) {
    std::vector<Card,_std::allocator<Card>_>::vector(&local_30,pvVar1 + playerID);
    std::vector<Card,_std::allocator<Card>_>::vector(&local_48,&local_30);
    local_18 = card;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_equals_val<Card_const>>
                      (local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return _Var2._M_current !=
           local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

bool Game::hasCard(size_t playerID, Card card){
   auto playerHand = m_playerCards.at(playerID);
   return contains(playerHand, card);
}